

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

NodeSequence __thiscall
GraphBuilder::insertFunction(GraphBuilder *this,Function *function,CallInst *callInstruction)

{
  long lVar1;
  Node *node;
  CallInst *callInst;
  NodeSequence NVar2;
  NodeSequence NVar3;
  
  if (*(Function **)(function + 0x48) == function + 0x48) {
    NVar3 = insertUndefinedFunction(this,function,callInstruction);
  }
  else {
    lVar1 = *(long *)(callInstruction + -0x20);
    if (((lVar1 == 0) || (*(char *)(lVar1 + 0x10) != '\0')) ||
       (*(long *)(lVar1 + 0x18) != *(long *)(callInstruction + 0x48))) {
      node = (Node *)operator_new(0x80);
      callInst = callInstruction;
      callInstruction = (CallInst *)(Instruction *)0x0;
    }
    else {
      node = (Node *)operator_new(0x80);
      callInst = (CallInst *)0x0;
    }
    CallNode::CallNode((CallNode *)node,(Instruction *)callInstruction,callInst);
    addNode<Node>(this,node);
    NVar2 = createOrGetFunction(this,function);
    NVar3.second = NVar2.second;
    NVar3.first = node;
    Node::addSuccessor(node,NVar2.first);
  }
  return NVar3;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertFunction(const Function *function,
                             const CallInst *callInstruction) {
    if (function->empty()) {
        return insertUndefinedFunction(function, callInstruction);
    }
    Node *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = createNode<NodeType::CALL>(callInstruction);
    } else {
        callNode = createNode<NodeType::CALL>(nullptr, callInstruction);
    }
    addNode(callNode);
    auto nodeSeq = createOrGetFunction(function);
    callNode->addSuccessor(nodeSeq.first);
    return {callNode, nodeSeq.second};
}